

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O3

cmList * __thiscall cmList::sort(cmList *this,SortConfiguration *cfg)

{
  ComparisonFunction *pCVar1;
  CompareMethod CVar2;
  pointer pbVar3;
  pointer pbVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  long lVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last_00;
  _Any_data *p_Var12;
  _Any_data *__x;
  StringSorter sorter;
  _Val_comp_iter<(anonymous_namespace)::StringSorter> local_448;
  cmList *local_3e0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3d8;
  _Any_data local_3b8;
  undefined8 local_3a8 [2];
  _Any_data local_398;
  _Manager_type local_388;
  _Invoker_type local_380;
  undefined1 local_378;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_370;
  _Any_data local_350;
  undefined8 local_340 [2];
  _Any_data local_330;
  code *local_320;
  undefined1 local_310;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_308;
  code *local_2e8 [2];
  code *local_2d8 [2];
  _Any_data local_2c8;
  code *local_2b8;
  code *local_2b0;
  undefined1 local_2a8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2a0;
  _Any_data local_280;
  undefined8 local_270 [2];
  _Any_data local_260;
  _Manager_type local_250;
  _Invoker_type p_Stack_248;
  undefined1 local_240;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_238;
  _Any_data local_218;
  undefined8 local_208 [2];
  _Any_data local_1f8;
  _Manager_type local_1e8;
  _Invoker_type p_Stack_1e0;
  undefined1 local_1d8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1d0;
  _Any_data local_1b0;
  undefined8 local_1a0 [2];
  _Any_data local_190;
  code *local_180;
  undefined1 local_170;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_168;
  _Any_data local_148;
  undefined8 local_138 [2];
  _Any_data local_128;
  code *local_118;
  undefined1 local_108;
  _Iter_comp_iter<(anonymous_namespace)::StringSorter> local_100;
  _Iter_comp_iter<(anonymous_namespace)::StringSorter> local_98;
  
  CVar2 = cfg->Compare;
  if (cfg->Order < DESCENDING && (cfg->Case < INSENSITIVE && CVar2 < FILE_BASENAME)) {
    pbVar3 = (this->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->Values).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 != pbVar4) {
      uVar10 = (long)pbVar4 - (long)pbVar3 >> 5;
      lVar11 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar3,pbVar4,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar3,pbVar4);
    }
  }
  else {
    local_308.super__Function_base._M_manager = (_Manager_type)0x0;
    local_308._M_invoker = (_Invoker_type)0x0;
    local_308.super__Function_base._M_functor._M_unused._M_object = (code *)0x0;
    local_308.super__Function_base._M_functor._8_8_ = 0;
    if (CVar2 == FILE_BASENAME) {
      local_308.super__Function_base._M_functor._M_unused._M_object =
           cmsys::SystemTools::GetFilenameName;
      local_308._M_invoker =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::_M_invoke;
      local_308.super__Function_base._M_manager =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::_M_manager;
    }
    local_2d8[0] = (code *)0x0;
    local_2d8[1] = (code *)0x0;
    local_2e8[0] = (code *)0x0;
    local_2e8[1] = (code *)0x0;
    if (cfg->Case == INSENSITIVE) {
      local_2e8[0] = cmsys::SystemTools::LowerCase;
      local_2d8[1] = std::
                     _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     ::_M_invoke;
      local_2d8[0] = std::
                     _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     ::_M_manager;
    }
    local_2c8._M_unused._M_object = (void *)0x0;
    local_2c8._8_8_ = 0;
    local_2b0 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:133:7)>
                ::_M_invoke;
    if (CVar2 == NATURAL) {
      local_2b0 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:128:9)>
                  ::_M_invoke;
    }
    local_2b8 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:133:7)>
                ::_M_manager;
    if (CVar2 == NATURAL) {
      local_2b8 = std::
                  _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmList.cxx:128:9)>
                  ::_M_manager;
    }
    local_2a8 = cfg->Order == DESCENDING;
    __first._M_current =
         (this->Values).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->Values).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_3e0 = this;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_168,&local_308);
    __x = (_Any_data *)local_2e8;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_148,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)__x);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_128,
               (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_2c8);
    local_108 = local_2a8;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(&local_2a0,&local_168);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_280,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_148);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_260,
               (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_128);
    local_380 = p_Stack_248;
    local_240 = local_108;
    lVar11 = 0;
    do {
      *(undefined8 *)((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11)
           = 0;
      *(undefined8 *)
       ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11 + 8) = 0;
      *(undefined8 *)((long)&local_448._M_comp.Filters[0].super__Function_base._M_manager + lVar11)
           = 0;
      lVar5 = *(long *)((long)&local_2a0.super__Function_base._M_manager + lVar11);
      *(undefined8 *)((long)&local_448._M_comp.Filters[0]._M_invoker + lVar11) =
           *(undefined8 *)((long)&local_2a0._M_invoker + lVar11);
      if (lVar5 != 0) {
        uVar6 = *(undefined4 *)((long)&local_2a0.super__Function_base._M_functor + lVar11 + 4);
        uVar7 = *(undefined4 *)((long)&local_2a0.super__Function_base._M_functor + lVar11 + 8);
        uVar8 = *(undefined4 *)((long)&local_2a0.super__Function_base._M_functor + lVar11 + 0xc);
        *(undefined4 *)
         ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11) =
             *(undefined4 *)((long)&local_2a0.super__Function_base._M_functor + lVar11);
        *(undefined4 *)
         ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11 + 4) = uVar6;
        *(undefined4 *)
         ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11 + 8) = uVar7;
        *(undefined4 *)
         ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11 + 0xc) =
             uVar8;
        *(long *)((long)&local_448._M_comp.Filters[0].super__Function_base._M_manager + lVar11) =
             lVar5;
        *(undefined8 *)((long)&local_2a0.super__Function_base._M_manager + lVar11) = 0;
        *(undefined8 *)((long)&local_2a0._M_invoker + lVar11) = 0;
      }
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x40);
    local_448._M_comp.SortMethod.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_448._M_comp.SortMethod.super__Function_base._M_functor._8_8_ = 0;
    local_448._M_comp.SortMethod.super__Function_base._M_manager = (_Manager_type)0x0;
    local_448._M_comp.SortMethod._M_invoker = p_Stack_248;
    if (local_250 != (_Manager_type)0x0) {
      local_448._M_comp.SortMethod.super__Function_base._M_functor._4_4_ = local_260._4_4_;
      local_448._M_comp.SortMethod.super__Function_base._M_functor._0_4_ = local_260._0_4_;
      local_448._M_comp.SortMethod.super__Function_base._M_functor._12_4_ = local_260._12_4_;
      local_448._M_comp.SortMethod.super__Function_base._M_functor._8_4_ = local_260._8_4_;
      local_448._M_comp.SortMethod.super__Function_base._M_manager = local_250;
      local_250 = (_Manager_type)0x0;
      p_Stack_248 = (_Invoker_type)0x0;
    }
    local_448._M_comp.Descending = (bool)local_108;
    lVar11 = 0;
    do {
      *(undefined8 *)((long)&local_3d8.super__Function_base._M_functor + lVar11) = 0;
      *(undefined8 *)((long)&local_3d8.super__Function_base._M_functor + lVar11 + 8) = 0;
      *(undefined8 *)((long)&local_3d8.super__Function_base._M_manager + lVar11) = 0;
      lVar5 = *(long *)((long)&local_448._M_comp.Filters[0].super__Function_base._M_manager + lVar11
                       );
      *(undefined8 *)((long)&local_3d8._M_invoker + lVar11) =
           *(undefined8 *)((long)&local_448._M_comp.Filters[0]._M_invoker + lVar11);
      if (lVar5 != 0) {
        uVar6 = *(undefined4 *)
                 ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11 + 4);
        uVar7 = *(undefined4 *)
                 ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11 + 8);
        uVar8 = *(undefined4 *)
                 ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11 + 0xc
                 );
        *(undefined4 *)((long)&local_3d8.super__Function_base._M_functor + lVar11) =
             *(undefined4 *)
              ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11);
        *(undefined4 *)((long)&local_3d8.super__Function_base._M_functor + lVar11 + 4) = uVar6;
        *(undefined4 *)((long)&local_3d8.super__Function_base._M_functor + lVar11 + 8) = uVar7;
        *(undefined4 *)((long)&local_3d8.super__Function_base._M_functor + lVar11 + 0xc) = uVar8;
        *(long *)((long)&local_3d8.super__Function_base._M_manager + lVar11) = lVar5;
        *(undefined8 *)
         ((long)&local_448._M_comp.Filters[0].super__Function_base._M_manager + lVar11) = 0;
        *(undefined8 *)((long)&local_448._M_comp.Filters[0]._M_invoker + lVar11) = 0;
      }
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0x40);
    local_398._M_unused._M_object = (void *)0x0;
    local_398._8_8_ = 0;
    local_388 = (_Manager_type)0x0;
    if (local_448._M_comp.SortMethod.super__Function_base._M_manager != (_Manager_type)0x0) {
      local_398._M_unused._M_object =
           local_448._M_comp.SortMethod.super__Function_base._M_functor._M_unused._M_object;
      local_398._8_8_ = local_448._M_comp.SortMethod.super__Function_base._M_functor._8_8_;
      local_388 = local_448._M_comp.SortMethod.super__Function_base._M_manager;
      local_448._M_comp.SortMethod.super__Function_base._M_manager = (_Manager_type)0x0;
      local_448._M_comp.SortMethod._M_invoker = (_Invoker_type)0x0;
    }
    local_378 = local_108;
    lVar11 = -0x40;
    p_Var12 = (_Any_data *)(local_448._M_comp.Filters + 1);
    do {
      if (*(code **)(p_Var12 + 1) != (code *)0x0) {
        (**(code **)(p_Var12 + 1))(p_Var12,p_Var12,__destroy_functor);
      }
      p_Var12 = p_Var12 + -2;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    if (__first._M_current != __last._M_current) {
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_100,&local_3d8);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function(local_100._M_comp.Filters + 1,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_3b8);
      pCVar1 = &local_100._M_comp.SortMethod;
      std::
      function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function(pCVar1,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *)&local_398);
      uVar10 = (long)__last._M_current - (long)__first._M_current >> 5;
      lVar11 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      local_100._M_comp.Descending = (bool)local_378;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StringSorter>>
                (__first,__last,(ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,&local_100);
      if (local_100._M_comp.SortMethod.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_100._M_comp.SortMethod.super__Function_base._M_manager)
                  ((_Any_data *)pCVar1,(_Any_data *)pCVar1,__destroy_functor);
      }
      lVar11 = -0x40;
      p_Var12 = (_Any_data *)(local_100._M_comp.Filters + 1);
      do {
        if (*(code **)(p_Var12 + 1) != (code *)0x0) {
          (**(code **)(p_Var12 + 1))(p_Var12,p_Var12,__destroy_functor);
        }
        p_Var12 = p_Var12 + -2;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function(&local_370,&local_3d8);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_350,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_3b8);
      std::
      function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_330,
                 (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_398);
      local_310 = local_378;
      if ((long)__last._M_current - (long)__first._M_current < 0x201) {
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_448,&local_370);
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function(local_448._M_comp.Filters + 1,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_350);
        pCVar1 = &local_448._M_comp.SortMethod;
        std::
        function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function(pCVar1,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)&local_330);
        local_448._M_comp.Descending = (bool)local_310;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StringSorter>>
                  (__first,__last,(_Iter_comp_iter<(anonymous_namespace)::StringSorter> *)&local_448
                  );
        if (local_448._M_comp.SortMethod.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_448._M_comp.SortMethod.super__Function_base._M_manager)
                    ((_Any_data *)pCVar1,(_Any_data *)pCVar1,__destroy_functor);
        }
        lVar11 = -0x40;
        p_Var12 = (_Any_data *)(local_448._M_comp.Filters + 1);
        do {
          if (*(code **)(p_Var12 + 1) != (code *)0x0) {
            (**(code **)(p_Var12 + 1))(p_Var12,p_Var12,__destroy_functor);
          }
          p_Var12 = p_Var12 + -2;
          lVar11 = lVar11 + 0x20;
        } while (lVar11 != 0);
      }
      else {
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_98,&local_370);
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function(local_98._M_comp.Filters + 1,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_350);
        pCVar1 = &local_98._M_comp.SortMethod;
        std::
        function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function(pCVar1,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)&local_330);
        __last_00._M_current = __first._M_current + 0x10;
        local_98._M_comp.Descending = (bool)local_310;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::StringSorter>>
                  (__first,__last_00,&local_98);
        if (local_98._M_comp.SortMethod.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_98._M_comp.SortMethod.super__Function_base._M_manager)
                    ((_Any_data *)pCVar1,(_Any_data *)pCVar1,__destroy_functor);
        }
        lVar11 = -0x40;
        p_Var12 = (_Any_data *)(local_98._M_comp.Filters + 1);
        do {
          if (*(code **)(p_Var12 + 1) != (code *)0x0) {
            (**(code **)(p_Var12 + 1))(p_Var12,p_Var12,__destroy_functor);
          }
          p_Var12 = p_Var12 + -2;
          lVar11 = lVar11 + 0x20;
        } while (lVar11 != 0);
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function(&local_1d0,&local_370);
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_1b0,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_350);
        std::
        function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_190,
                   (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_330);
        local_170 = local_310;
        if (__last_00._M_current != __last._M_current) {
          do {
            std::
            function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function(&local_238,&local_1d0);
            std::
            function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_218,
                       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_1b0);
            std::
            function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_1f8,
                       (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_190);
            local_1d8 = local_170;
            lVar11 = 0;
            do {
              *(undefined8 *)
               ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11) = 0;
              *(undefined8 *)
               ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11 + 8) =
                   0;
              *(undefined8 *)
               ((long)&local_448._M_comp.Filters[0].super__Function_base._M_manager + lVar11) = 0;
              lVar5 = *(long *)((long)&local_238.super__Function_base._M_manager + lVar11);
              *(undefined8 *)((long)&local_448._M_comp.Filters[0]._M_invoker + lVar11) =
                   *(undefined8 *)((long)&local_238._M_invoker + lVar11);
              if (lVar5 != 0) {
                uVar9 = *(undefined8 *)
                         ((long)&local_238.super__Function_base._M_functor + lVar11 + 8);
                *(undefined8 *)
                 ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11) =
                     *(undefined8 *)((long)&local_238.super__Function_base._M_functor + lVar11);
                *(undefined8 *)
                 ((long)&local_448._M_comp.Filters[0].super__Function_base._M_functor + lVar11 + 8)
                     = uVar9;
                *(long *)((long)&local_448._M_comp.Filters[0].super__Function_base._M_manager +
                         lVar11) = lVar5;
                *(undefined8 *)((long)&local_238.super__Function_base._M_manager + lVar11) = 0;
                *(undefined8 *)((long)&local_238._M_invoker + lVar11) = 0;
              }
              lVar11 = lVar11 + 0x20;
            } while (lVar11 != 0x40);
            local_448._M_comp.SortMethod.super__Function_base._M_functor._M_unused._M_object =
                 (void *)0x0;
            local_448._M_comp.SortMethod.super__Function_base._M_functor._8_8_ = 0;
            local_448._M_comp.SortMethod.super__Function_base._M_manager = (_Manager_type)0x0;
            local_448._M_comp.SortMethod._M_invoker = p_Stack_1e0;
            if (local_1e8 != (_Manager_type)0x0) {
              local_448._M_comp.SortMethod.super__Function_base._M_functor._M_unused._M_object =
                   local_1f8._M_unused._M_object;
              local_448._M_comp.SortMethod.super__Function_base._M_functor._8_8_ = local_1f8._8_8_;
              local_448._M_comp.SortMethod.super__Function_base._M_manager = local_1e8;
              local_1e8 = (_Manager_type)0x0;
              p_Stack_1e0 = (_Invoker_type)0x0;
            }
            local_448._M_comp.Descending = (bool)local_170;
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::StringSorter>>
                      (__last_00,&local_448);
            if (local_448._M_comp.SortMethod.super__Function_base._M_manager != (_Manager_type)0x0)
            {
              pCVar1 = &local_448._M_comp.SortMethod;
              (*local_448._M_comp.SortMethod.super__Function_base._M_manager)
                        ((_Any_data *)pCVar1,(_Any_data *)pCVar1,__destroy_functor);
            }
            lVar11 = -0x40;
            p_Var12 = (_Any_data *)(local_448._M_comp.Filters + 1);
            do {
              if (*(code **)(p_Var12 + 1) != (code *)0x0) {
                (**(code **)(p_Var12 + 1))(p_Var12,p_Var12,__destroy_functor);
              }
              p_Var12 = p_Var12 + -2;
              lVar11 = lVar11 + 0x20;
            } while (lVar11 != 0);
            if (local_1e8 != (_Manager_type)0x0) {
              (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
            }
            lVar11 = -0x40;
            p_Var12 = &local_218;
            do {
              if (*(code **)(p_Var12 + 1) != (code *)0x0) {
                (**(code **)(p_Var12 + 1))(p_Var12,p_Var12,__destroy_functor);
              }
              p_Var12 = p_Var12 + -2;
              lVar11 = lVar11 + 0x20;
            } while (lVar11 != 0);
            __last_00._M_current = __last_00._M_current + 1;
          } while (__last_00._M_current != __last._M_current);
        }
        if (local_180 != (code *)0x0) {
          (*local_180)(&local_190,&local_190,__destroy_functor);
        }
        lVar11 = -0x40;
        p_Var12 = &local_1b0;
        do {
          if (*(code **)(p_Var12 + 1) != (code *)0x0) {
            (**(code **)(p_Var12 + 1))(p_Var12,p_Var12,__destroy_functor);
          }
          p_Var12 = p_Var12 + -2;
          lVar11 = lVar11 + 0x20;
        } while (lVar11 != 0);
      }
      if (local_320 != (code *)0x0) {
        (*local_320)(&local_330,&local_330,__destroy_functor);
      }
      lVar11 = -0x40;
      p_Var12 = &local_350;
      do {
        if (*(code **)(p_Var12 + 1) != (code *)0x0) {
          (**(code **)(p_Var12 + 1))(p_Var12,p_Var12,__destroy_functor);
        }
        p_Var12 = p_Var12 + -2;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0);
    }
    if (local_388 != (_Manager_type)0x0) {
      (*local_388)(&local_398,&local_398,__destroy_functor);
    }
    lVar11 = -0x40;
    p_Var12 = &local_3b8;
    do {
      if (*(code **)(p_Var12 + 1) != (code *)0x0) {
        (**(code **)(p_Var12 + 1))(p_Var12,p_Var12,__destroy_functor);
      }
      p_Var12 = p_Var12 + -2;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    if (local_250 != (_Manager_type)0x0) {
      (*local_250)(&local_260,&local_260,__destroy_functor);
    }
    lVar11 = -0x40;
    p_Var12 = &local_280;
    do {
      if (*(code **)(p_Var12 + 1) != (code *)0x0) {
        (**(code **)(p_Var12 + 1))(p_Var12,p_Var12,__destroy_functor);
      }
      p_Var12 = p_Var12 + -2;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    if (local_118 != (code *)0x0) {
      (*local_118)(&local_128,&local_128,__destroy_functor);
    }
    lVar11 = -0x40;
    p_Var12 = &local_148;
    do {
      if (*(code **)(p_Var12 + 1) != (code *)0x0) {
        (**(code **)(p_Var12 + 1))(p_Var12,p_Var12,__destroy_functor);
      }
      p_Var12 = p_Var12 + -2;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    if (local_2b8 != (code *)0x0) {
      (*local_2b8)(&local_2c8,&local_2c8,__destroy_functor);
    }
    this = local_3e0;
    lVar11 = -0x40;
    do {
      if (*(code **)(__x + 1) != (code *)0x0) {
        (**(code **)(__x + 1))(__x,__x,__destroy_functor);
      }
      __x = __x + -2;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
  }
  return this;
}

Assistant:

cmList& cmList::sort(const SortConfiguration& cfg)
{
  SortConfiguration config{ cfg };

  if (config.Order == SortConfiguration::OrderMode::DEFAULT) {
    config.Order = SortConfiguration::OrderMode::ASCENDING;
  }
  if (config.Compare == SortConfiguration::CompareMethod::DEFAULT) {
    config.Compare = SortConfiguration::CompareMethod::STRING;
  }
  if (config.Case == SortConfiguration::CaseSensitivity::DEFAULT) {
    config.Case = SortConfiguration::CaseSensitivity::SENSITIVE;
  }

  if ((config.Compare == SortConfiguration::CompareMethod::STRING) &&
      (config.Case == SortConfiguration::CaseSensitivity::SENSITIVE) &&
      (config.Order == SortConfiguration::OrderMode::ASCENDING)) {
    std::sort(this->Values.begin(), this->Values.end());
  } else {
    StringSorter sorter(config);
    std::sort(this->Values.begin(), this->Values.end(), sorter);
  }

  return *this;
}